

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O1

void __thiscall
Symbol_table::define_name(Symbol_table *this,string *name,double value,bool is_const)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  runtime_error *this_00;
  Variable local_78;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  bVar3 = is_declared(this,name);
  if (!bVar3) {
    pcVar2 = (name->_M_dataplus)._M_p;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + name->_M_string_length);
    paVar1 = &local_78.name.field_2;
    local_78.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_48,local_40 + (long)local_48);
    local_78.value = value;
    local_78.is_const = is_const;
    std::vector<Variable,_std::allocator<Variable>_>::emplace_back<Variable>
              ((vector<Variable,_std::allocator<Variable>_> *)this,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.name._M_dataplus._M_p,local_78.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    return;
  }
  local_78.name._M_dataplus._M_p = (pointer)&local_78.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"redeclaration of variable","");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)&local_78);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Symbol_table::define_name(const string& name, double value, bool is_const = false)
{
	if (is_declared(name))
		error("redeclaration of variable");
	var_table.push_back(Variable(name, value, is_const));
}